

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxx_message.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cxx::MessageGenerator::GenerateSerializeWithCachedSizes
          (MessageGenerator *this,Printer *printer)

{
  bool bVar1;
  MessageOptions *this_00;
  FileDescriptor *file;
  Printer *printer_local;
  MessageGenerator *this_local;
  
  this_00 = Descriptor::options(this->descriptor_);
  bVar1 = MessageOptions::message_set_wire_format(this_00);
  if (bVar1) {
    io::Printer::Print(printer,
                       "void $classname$::SerializeWithCachedSizes(\n    ::google::protobuf::io::CodedOutputStream* output) const {\n  _extensions_.SerializeMessageSetWithCachedSizes(output);\n"
                       ,"classname",&this->classname_);
    file = Descriptor::file(this->descriptor_);
    bVar1 = HasUnknownFields(file);
    if (bVar1) {
      io::Printer::Print(printer,
                         "  ::google::protobuf::internal::WireFormat::SerializeUnknownMessageSetItems(\n      unknown_fields(), output);\n"
                        );
    }
    io::Printer::Print(printer,"}\n");
  }
  else {
    io::Printer::Print(printer,
                       "void $classname$::SerializeWithCachedSizes(\n    ::google::protobuf::io::CodedOutputStream* output) const {\n"
                       ,"classname",&this->classname_);
    io::Printer::Indent(printer);
    GenerateSerializeWithCachedSizesBody(this,printer,false);
    io::Printer::Outdent(printer);
    io::Printer::Print(printer,"}\n");
  }
  return;
}

Assistant:

void MessageGenerator::
GenerateSerializeWithCachedSizes(io::Printer* printer) {
  if (descriptor_->options().message_set_wire_format()) {
    // Special-case MessageSet.
    printer->Print(
      "void $classname$::SerializeWithCachedSizes(\n"
      "    ::google::protobuf::io::CodedOutputStream* output) const {\n"
      "  _extensions_.SerializeMessageSetWithCachedSizes(output);\n",
      "classname", classname_);
    if (HasUnknownFields(descriptor_->file())) {
      printer->Print(
        "  ::google::protobuf::internal::WireFormat::SerializeUnknownMessageSetItems(\n"
        "      unknown_fields(), output);\n");
    }
    printer->Print(
      "}\n");
    return;
  }

  printer->Print(
    "void $classname$::SerializeWithCachedSizes(\n"
    "    ::google::protobuf::io::CodedOutputStream* output) const {\n",
    "classname", classname_);
  printer->Indent();

  GenerateSerializeWithCachedSizesBody(printer, false);

  printer->Outdent();
  printer->Print(
    "}\n");
}